

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

predictor * __thiscall
Search::predictor::add_to<unsigned_int>
          (predictor *this,v_array<unsigned_int> *A,bool *A_is_ptr,uint *a,size_t count,
          bool clear_first)

{
  uint *puVar1;
  uint *puVar2;
  uint *__dest;
  long lVar3;
  
  puVar2 = A->_begin;
  lVar3 = (long)A->_end - (long)puVar2;
  if (lVar3 == 0) {
    if (*A_is_ptr == false) {
      if (puVar2 != (uint *)0x0) {
        free(puVar2);
      }
      A->_begin = (uint *)0x0;
      A->_end = (uint *)0x0;
      A->end_array = (uint *)0x0;
    }
    puVar2 = a + count;
    if (a == (uint *)0x0) {
      puVar2 = (uint *)0x0;
    }
    A->_begin = a;
    A->_end = puVar2;
    A->end_array = puVar2;
    *A_is_ptr = true;
  }
  else if (*A_is_ptr == false) {
    if (clear_first) {
      v_array<unsigned_int>::clear(A);
    }
    if (a != (uint *)0x0) {
      push_many<unsigned_int>(A,a,count);
    }
  }
  else {
    if (clear_first) {
      A->_end = puVar2;
      lVar3 = 0;
    }
    else {
      lVar3 = lVar3 >> 2;
    }
    puVar1 = A->_end;
    __dest = calloc_or_throw<unsigned_int>(lVar3 + count);
    A->_begin = __dest;
    A->_end = __dest + lVar3 + count;
    A->end_array = __dest + lVar3 + count;
    memcpy(__dest,puVar2,(long)puVar1 - (long)puVar2);
    *A_is_ptr = false;
    if (a != (uint *)0x0) {
      memcpy(A->_begin + lVar3,a,count << 2);
    }
  }
  return this;
}

Assistant:

predictor& predictor::add_to(v_array<T>& A, bool& A_is_ptr, T* a, size_t count, bool clear_first)
{
  size_t old_size = A.size();
  if (old_size > 0)
  {
    if (A_is_ptr)  // we need to make our own memory
    {
      if (clear_first)
      {
        A.end() = A.begin();
        old_size = 0;
      }
      size_t new_size = old_size + count;
      make_new_pointer<T>(A, new_size);
      A_is_ptr = false;
      if (a != nullptr)
        memcpy(A.begin() + old_size, a, count * sizeof(T));
    }
    else  // we already have our own memory
    {
      if (clear_first)
        A.clear();
      if (a != nullptr)
        push_many<T>(A, a, count);
    }
  }
  else  // old_size == 0, clear_first is irrelevant
  {
    if (!A_is_ptr)
      A.delete_v();  // avoid memory leak

    A.begin() = a;
    if (a != nullptr)  // a is not nullptr
      A.end() = a + count;
    else
      A.end() = a;
    A.end_array = A.end();
    A_is_ptr = true;
  }
  return *this;
}